

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_set_shape(adios2_variable *variable,size_t ndims,size_t *shape)

{
  Dims shapeV;
  allocator_type local_79;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,"for adios2_variable, in call to adios2_set_shape",
             (allocator *)&local_78);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_58,"for start, in call to adios2_set_shape",(allocator *)&local_78);
  adios2::helper::CheckForNullptr<unsigned_long_const>(shape,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,shape,shape + ndims,
             &local_79);
  adios2::core::VariableBase::SetShape((vector *)variable);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_shape(adios2_variable *variable, const size_t ndims, const size_t *shape)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_shape");
        adios2::helper::CheckForNullptr(shape, "for start, in call to "
                                               "adios2_set_shape");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::Dims shapeV(shape, shape + ndims);
        variableBase->SetShape(shapeV);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_shape"));
    }
}